

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_alignment.cpp
# Opt level: O0

void get_fixed_sizes(Am_Object *self,Am_Value_List *components,int *fixed_width,int *fixed_height)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  int local_4c;
  int local_48;
  int max_height;
  int max_width;
  undefined1 local_38 [8];
  Am_Value value;
  int *fixed_height_local;
  int *fixed_width_local;
  Am_Value_List *components_local;
  Am_Object *self_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)fixed_height;
  Am_Value::Am_Value((Am_Value *)local_38);
  pAVar3 = Am_Object::Get(self,0x99,0);
  Am_Value::operator=((Am_Value *)local_38,pAVar3);
  if (local_38._0_2_ == 2) {
    iVar2 = Am_Value::operator_cast_to_int((Am_Value *)local_38);
    *fixed_width = iVar2;
  }
  else {
    bVar1 = Am_Value::operator_cast_to_bool((Am_Value *)local_38);
    *fixed_width = (uint)bVar1;
  }
  pAVar3 = Am_Object::Get(self,0x9a,0);
  Am_Value::operator=((Am_Value *)local_38,pAVar3);
  if (local_38._0_2_ == 2) {
    iVar2 = Am_Value::operator_cast_to_int((Am_Value *)local_38);
    *(int *)&((value.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type =
         iVar2;
  }
  else {
    bVar1 = Am_Value::operator_cast_to_bool((Am_Value *)local_38);
    *(uint *)&((value.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type =
         (uint)bVar1;
  }
  if ((*(int *)&((value.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type ==
       1) || (*fixed_width == 1)) {
    get_max_sizes(components,&local_48,&local_4c);
    if (*fixed_width == 1) {
      *fixed_width = local_48;
    }
    if (*(int *)&((value.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type ==
        1) {
      *(int *)&((value.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type =
           local_4c;
    }
  }
  Am_Value::~Am_Value((Am_Value *)local_38);
  return;
}

Assistant:

void
get_fixed_sizes(Am_Object self, Am_Value_List &components, int &fixed_width,
                int &fixed_height)
{
  Am_Value value;
  value = self.Get(Am_FIXED_WIDTH);
  // the case where CC gets a bool as an int is taken care of automatically:
  // Am_MAX_FIXED_SIZE == 1 == (int)true; Am_NOT_FIXED_SIZE == 0 == (int)false
  if (value.type == Am_INT)
    fixed_width = value;
  else
    fixed_width = (bool)value ? Am_MAX_FIXED_SIZE : Am_NOT_FIXED_SIZE;
  value = self.Get(Am_FIXED_HEIGHT);
  if (value.type == Am_INT)
    fixed_height = value;
  else
    fixed_height = (bool)value ? Am_MAX_FIXED_SIZE : Am_NOT_FIXED_SIZE;
  if ((fixed_height == Am_MAX_FIXED_SIZE) ||
      (fixed_width == Am_MAX_FIXED_SIZE)) {
    int max_width, max_height;
    get_max_sizes(components, max_width, max_height);
    if (fixed_width == Am_MAX_FIXED_SIZE)
      fixed_width = max_width;
    if (fixed_height == Am_MAX_FIXED_SIZE)
      fixed_height = max_height;
  }
}